

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_body(Curl_easy *data,connectdata *conn,Curl_HttpReq httpreq,char **tep)

{
  char *pcVar1;
  undefined1 *puVar2;
  HTTP *pHVar3;
  _Bool _Var4;
  CURLcode CVar5;
  char *pcVar6;
  char *pcVar7;
  curl_off_t cVar8;
  curl_mimepart *pcVar9;
  
  pHVar3 = (data->req).p.http;
  pHVar3->postsize = 0;
  if (httpreq == HTTPREQ_POST_FORM) {
    pcVar9 = &pHVar3->form;
    Curl_mime_cleanpart(pcVar9);
    CVar5 = Curl_getformdata(data,pcVar9,(data->set).httppost,(data->state).fread_func);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
  }
  else {
    if (httpreq != HTTPREQ_POST_MIME) {
      pHVar3->sendit = (curl_mimepart *)0x0;
      goto LAB_0060106d;
    }
    pcVar9 = &(data->set).mimepost;
  }
  pHVar3->sendit = pcVar9;
  pcVar6 = Curl_checkheaders(data,"Content-Type",0xc);
  pcVar9 = pHVar3->sendit;
  pcVar9->flags = pcVar9->flags | 2;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (char *)0x0;
    if (pcVar9->kind == MIMEKIND_MULTIPART) {
      pcVar6 = "multipart/form-data";
    }
  }
  else {
    pcVar7 = pcVar6 + 0xc;
    do {
      pcVar6 = pcVar7 + 1;
      pcVar1 = pcVar7 + 1;
      pcVar7 = pcVar6;
    } while (*pcVar1 == ' ');
  }
  curl_mime_headers(pcVar9,(data->set).headers,0);
  CVar5 = Curl_mime_prepare_headers(pHVar3->sendit,pcVar6,(char *)0x0,MIMESTRATEGY_FORM);
  curl_mime_headers(pHVar3->sendit,(curl_slist *)0x0,0);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  CVar5 = Curl_mime_rewind(pHVar3->sendit);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  cVar8 = Curl_mime_size(pHVar3->sendit);
  pHVar3->postsize = cVar8;
LAB_0060106d:
  pcVar6 = Curl_checkheaders(data,"Transfer-Encoding",0x11);
  if (pcVar6 == (char *)0x0) {
    if (((conn->handler->protocol & 3) == 0) ||
       ((((httpreq & ~HTTPREQ_POST) != HTTPREQ_POST_FORM || (-1 < pHVar3->postsize)) &&
        (((httpreq != HTTPREQ_POST && ((*(ulong *)&(data->set).field_0x8e2 & 0x4000000) == 0)) ||
         ((data->state).infilesize != -1)))))) {
      puVar2 = &(data->req).field_0xd9;
      *puVar2 = *puVar2 & 0x7f;
    }
    else if (((conn->bits).field_0x6 & 1) == 0) {
      if ((((data->state).httpversion == '\n') || (conn->httpversion == 10)) ||
         ((data->state).httpwant == '\x01')) {
        Curl_failf(data,"Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
      if (conn->httpversion < 0x14) {
        puVar2 = &(data->req).field_0xd9;
        *puVar2 = *puVar2 | 0x80;
      }
    }
    if (((data->req).field_0xd9 & 0x80) != 0) {
      *tep = "Transfer-Encoding: chunked\r\n";
    }
  }
  else {
    _Var4 = Curl_compareheader(pcVar6,"Transfer-Encoding:",0x12,"chunked",7);
    *(ushort *)&(data->req).field_0xd9 =
         *(ushort *)&(data->req).field_0xd9 & 0xff7f | (ushort)_Var4 << 7;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_body(struct Curl_easy *data, struct connectdata *conn,
                        Curl_HttpReq httpreq, const char **tep)
{
  CURLcode result = CURLE_OK;
  const char *ptr;
  struct HTTP *http = data->req.p.http;
  http->postsize = 0;

  switch(httpreq) {
  case HTTPREQ_POST_MIME:
    http->sendit = &data->set.mimepost;
    break;
  case HTTPREQ_POST_FORM:
    /* Convert the form structure into a mime structure. */
    Curl_mime_cleanpart(&http->form);
    result = Curl_getformdata(data, &http->form, data->set.httppost,
                              data->state.fread_func);
    if(result)
      return result;
    http->sendit = &http->form;
    break;
  default:
    http->sendit = NULL;
  }

#ifndef CURL_DISABLE_MIME
  if(http->sendit) {
    const char *cthdr = Curl_checkheaders(data, STRCONST("Content-Type"));

    /* Read and seek body only. */
    http->sendit->flags |= MIME_BODY_ONLY;

    /* Prepare the mime structure headers & set content type. */

    if(cthdr)
      for(cthdr += 13; *cthdr == ' '; cthdr++)
        ;
    else if(http->sendit->kind == MIMEKIND_MULTIPART)
      cthdr = "multipart/form-data";

    curl_mime_headers(http->sendit, data->set.headers, 0);
    result = Curl_mime_prepare_headers(http->sendit, cthdr,
                                       NULL, MIMESTRATEGY_FORM);
    curl_mime_headers(http->sendit, NULL, 0);
    if(!result)
      result = Curl_mime_rewind(http->sendit);
    if(result)
      return result;
    http->postsize = Curl_mime_size(http->sendit);
  }
#endif

  ptr = Curl_checkheaders(data, STRCONST("Transfer-Encoding"));
  if(ptr) {
    /* Some kind of TE is requested, check if 'chunked' is chosen */
    data->req.upload_chunky =
      Curl_compareheader(ptr,
                         STRCONST("Transfer-Encoding:"), STRCONST("chunked"));
  }
  else {
    if((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
       (((httpreq == HTTPREQ_POST_MIME || httpreq == HTTPREQ_POST_FORM) &&
         http->postsize < 0) ||
        ((data->set.upload || httpreq == HTTPREQ_POST) &&
         data->state.infilesize == -1))) {
      if(conn->bits.authneg)
        /* don't enable chunked during auth neg */
        ;
      else if(Curl_use_http_1_1plus(data, conn)) {
        if(conn->httpversion < 20)
          /* HTTP, upload, unknown file size and not HTTP 1.0 */
          data->req.upload_chunky = TRUE;
      }
      else {
        failf(data, "Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
    }
    else {
      /* else, no chunky upload */
      data->req.upload_chunky = FALSE;
    }

    if(data->req.upload_chunky)
      *tep = "Transfer-Encoding: chunked\r\n";
  }
  return result;
}